

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::WaitOrderStatementSyntax::getChild(WaitOrderStatementSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  undefined8 in_RDX;
  long in_RSI;
  ConstTokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff78;
  Info *in_stack_ffffffffffffff80;
  nullptr_t in_stack_ffffffffffffff88;
  ConstTokenOrSyntax *in_stack_ffffffffffffff90;
  
  switch(in_RDX) {
  case 0:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    break;
  case 1:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    break;
  case 2:
    token.info = in_stack_ffffffffffffff80;
    token._0_8_ = in_stack_ffffffffffffff78;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x4c5e64,token);
    break;
  case 3:
    token_00.info = in_stack_ffffffffffffff80;
    token_00._0_8_ = in_stack_ffffffffffffff78;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x4c5e94,token_00);
    break;
  case 4:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)(in_RSI + 0x78),in_stack_ffffffffffffff78);
    break;
  case 5:
    token_01.info = in_stack_ffffffffffffff80;
    token_01._0_8_ = in_stack_ffffffffffffff78;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x4c5f04,token_01);
    break;
  case 6:
    not_null<slang::syntax::ActionBlockSyntax_*>::get
              ((not_null<slang::syntax::ActionBlockSyntax_*> *)(in_RSI + 0xc0));
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  return in_RDI;
}

Assistant:

ConstTokenOrSyntax WaitOrderStatementSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return label;
        case 1: return &attributes;
        case 2: return wait_order;
        case 3: return openParen;
        case 4: return &names;
        case 5: return closeParen;
        case 6: return action.get();
        default: return nullptr;
    }
}